

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFXRefEntry.cc
# Opt level: O1

void __thiscall
QPDFXRefEntry::QPDFXRefEntry(QPDFXRefEntry *this,int type,qpdf_offset_t field1,int field2)

{
  logic_error *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this->type = type;
  this->field1 = field1;
  this->field2 = field2;
  if (0xfffffffd < type - 3U) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,type);
  std::operator+(&local_38,"invalid xref type ",&sStack_58);
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDFXRefEntry::QPDFXRefEntry(int type, qpdf_offset_t field1, int field2) :
    type(type),
    field1(field1),
    field2(field2)
{
    if ((type < 1) || (type > 2)) {
        throw std::logic_error("invalid xref type " + std::to_string(type));
    }
}